

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall jaegertracing::net::URI_testPrint_Test::URI_testPrint_Test(URI_testPrint_Test *this)

{
  URI_testPrint_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__URI_testPrint_Test_003b1628;
  return;
}

Assistant:

TEST(URI, testPrint)
{
    std::ostringstream oss;
    oss << URI::parse("localhost");
    ASSERT_EQ(
        "{ scheme=\"\""
        ", host=\"\""
        ", port=0"
        ", path=\"localhost\""
        ", query=\"\" }",
        oss.str());
}